

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_object.c
# Opt level: O1

ssize_t tnt_object_container_close(tnt_stream *s)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  long *plVar4;
  long *plVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  ssize_t sVar10;
  long lVar11;
  uint uVar12;
  
  plVar4 = (long *)s->data;
  plVar5 = (long *)plVar4[6];
  bVar1 = *(byte *)(plVar5 + 1);
  sVar10 = -1;
  if (bVar1 != 0) {
    lVar7 = *plVar5;
    lVar11 = (ulong)(bVar1 - 1) * 0x10;
    uVar12 = *(uint *)(lVar7 + 8 + lVar11);
    cVar2 = *(char *)(lVar7 + 0xc + lVar11);
    if ((uVar12 & 1) == 0 || cVar2 != '\x06') {
      uVar6 = *(ulong *)(lVar7 + lVar11);
      *(byte *)(plVar5 + 1) = bVar1 - 1;
      iVar3 = *(int *)((long)plVar5 + 0xc);
      if (iVar3 == 0) {
        sVar10 = 0;
      }
      else {
        if (iVar3 == 2) {
          lVar7 = (ulong)((uint)(cVar2 == '\x06') * 0x10000 + 0x10000 <= uVar12) * 2;
          lVar11 = lVar7 + 3;
          lVar9 = 1;
          if ((uint)(cVar2 == '\x06') * 0x10 + 0x10 <= uVar12) {
            lVar7 = (*(code *)plVar4[4])(s,lVar7 + 2);
            if (lVar7 == 0) {
              return -1;
            }
            memmove((void *)(*plVar4 + uVar6 + lVar11),(void *)(*plVar4 + uVar6 + 1),
                    ~uVar6 + plVar4[1]);
            lVar9 = lVar11;
          }
          lVar7 = *plVar4;
          if (cVar2 == '\x06') {
            uVar8 = uVar12 >> 1;
            if (uVar12 < 0x20) {
              *(byte *)(lVar7 + uVar6) = (byte)uVar8 | 0x80;
            }
            else if (uVar12 < 0x20000) {
              *(undefined1 *)(lVar7 + uVar6) = 0xde;
              *(ushort *)(lVar7 + 1 + uVar6) = (ushort)uVar8 << 8 | (ushort)uVar8 >> 8;
            }
            else {
              *(undefined1 *)(lVar7 + uVar6) = 0xdf;
              *(uint *)(lVar7 + 1 + uVar6) =
                   uVar12 >> 0x19 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
            }
          }
          else if (uVar12 < 0x10) {
            *(byte *)(lVar7 + uVar6) = (byte)uVar12 | 0x90;
          }
          else if (uVar12 < 0x10000) {
            *(undefined1 *)(lVar7 + uVar6) = 0xdc;
            *(ushort *)(lVar7 + 1 + uVar6) = (ushort)uVar12 << 8 | (ushort)uVar12 >> 8;
          }
          else {
            *(undefined1 *)(lVar7 + uVar6) = 0xdd;
            *(uint *)(lVar7 + 1 + uVar6) =
                 uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18
            ;
          }
          plVar4[1] = plVar4[1] + lVar9 + -1;
        }
        else {
          if (iVar3 != 1) {
            return -1;
          }
          lVar7 = *plVar4;
          if (cVar2 == '\x06') {
            uVar12 = uVar12 >> 1;
            *(undefined1 *)(lVar7 + uVar6) = 0xdf;
          }
          else {
            *(undefined1 *)(lVar7 + uVar6) = 0xdd;
          }
          *(uint *)(lVar7 + 1 + uVar6) =
               uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
        }
        sVar10 = 0;
      }
    }
  }
  return sVar10;
}

Assistant:

ssize_t
tnt_object_container_close (struct tnt_stream *s)
{
	struct tnt_stream_buf   *sb = TNT_SBUF_CAST(s);
	struct tnt_sbuf_object *sbo = TNT_SOBJ_CAST(s);
	if (sbo->stack_size == 0) return -1;
	size_t       size   = sbo->stack[sbo->stack_size - 1].size;
	enum mp_type type   = sbo->stack[sbo->stack_size - 1].type;
	size_t       offset = sbo->stack[sbo->stack_size - 1].offset;
	if (type == MP_MAP && size % 2) return -1;
	sbo->stack_size -= 1;
	char *lenp = sb->data + offset;
	if (sbo->type == TNT_SBO_SIMPLE) {
		return 0;
	} else if (sbo->type == TNT_SBO_SPARSE) {
		if (type == MP_MAP)
			mp_encode_map32(lenp, size/2);
		else
			mp_encode_array32(lenp, size);
		return 0;
	} else if (sbo->type == TNT_SBO_PACKED) {
		size_t sz = 0;
		if (type == MP_MAP)
			sz = mp_sizeof_map(size/2);
		else
			sz = mp_sizeof_array(size);
		if (sz > 1) {
			if (!sb->resize(s, sz - 1))
				return -1;
			lenp = sb->data + offset;
			memmove(lenp + sz, lenp + 1, sb->size - offset - 1);
		}
		if (type == MP_MAP) {
			mp_encode_map(sb->data + offset, size/2);
		} else {
			mp_encode_array(sb->data + offset, size);
		}
		sb->size += (sz - 1);
		return 0;
	}
	return -1;
}